

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  bool bVar1;
  anon_class_32_1_50637480_for__M_pred local_70;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_50;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_48;
  undefined1 local_40 [8];
  string config;
  ItemVector *items;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  config.field_2._8_8_ = cmComputeLinkInformation::GetItems(cli);
  cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)local_40,cli);
  local_48._M_current =
       (Item *)std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::begin((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                        *)config.field_2._8_8_);
  local_50._M_current =
       (Item *)std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::end((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                      *)config.field_2._8_8_);
  std::__cxx11::string::string((string *)&local_70,(string *)local_40);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<cmComputeLinkInformation::Item_const*,std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>>,cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                    (local_48,local_50,&local_70);
  ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0::~__0((__0 *)&local_70);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  return std::any_of(
    items.begin(), items.end(),
    [config](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION") &&
        item.Target->IsIPOEnabled("CUDA", config);
    });
}